

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O3

void __thiscall
btAlignedObjectArray<btAlignedObjectArray<int>_>::resize
          (btAlignedObjectArray<btAlignedObjectArray<int>_> *this,int newsize,
          btAlignedObjectArray<int> *fillData)

{
  uint uVar1;
  uint uVar2;
  btAlignedObjectArray<int> *pbVar3;
  int iVar4;
  long lVar5;
  
  uVar1 = this->m_size;
  iVar4 = uVar1 - newsize;
  if (iVar4 == 0 || (int)uVar1 < newsize) {
    if ((int)uVar1 < newsize) {
      if (this->m_capacity < newsize) {
        if (newsize == 0) {
          pbVar3 = (btAlignedObjectArray<int> *)0x0;
          uVar2 = uVar1;
        }
        else {
          pbVar3 = (btAlignedObjectArray<int> *)btAlignedAllocInternal((long)newsize << 5,0x10);
          uVar2 = this->m_size;
        }
        if (0 < (int)uVar2) {
          lVar5 = 0;
          do {
            btAlignedObjectArray<int>::btAlignedObjectArray
                      ((btAlignedObjectArray<int> *)((long)&pbVar3->field_0x0 + lVar5),
                       (btAlignedObjectArray<int> *)(&this->m_data->field_0x0 + lVar5));
            lVar5 = lVar5 + 0x20;
          } while ((ulong)uVar2 << 5 != lVar5);
          iVar4 = this->m_size;
          if (0 < (long)iVar4) {
            lVar5 = 0;
            do {
              btAlignedObjectArray<int>::~btAlignedObjectArray
                        ((btAlignedObjectArray<int> *)(&this->m_data->field_0x0 + lVar5));
              lVar5 = lVar5 + 0x20;
            } while ((long)iVar4 * 0x20 != lVar5);
          }
        }
        if ((this->m_data != (btAlignedObjectArray<int> *)0x0) && (this->m_ownsMemory == true)) {
          btAlignedFreeInternal(this->m_data);
        }
        this->m_ownsMemory = true;
        this->m_data = pbVar3;
        this->m_capacity = newsize;
        if (newsize <= (int)uVar1) goto LAB_001d0ddf;
      }
      lVar5 = (long)(int)uVar1 << 5;
      iVar4 = newsize - uVar1;
      do {
        btAlignedObjectArray<int>::btAlignedObjectArray
                  ((btAlignedObjectArray<int> *)(&this->m_data->field_0x0 + lVar5),fillData);
        lVar5 = lVar5 + 0x20;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
  }
  else {
    lVar5 = (long)newsize << 5;
    do {
      btAlignedObjectArray<int>::~btAlignedObjectArray
                ((btAlignedObjectArray<int> *)(&this->m_data->field_0x0 + lVar5));
      lVar5 = lVar5 + 0x20;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
LAB_001d0ddf:
  this->m_size = newsize;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void	resize(int newsize, const T& fillData=T())
		{
			const BT_REGISTER int curSize = size();

			if (newsize < curSize)
			{
				for(int i = newsize; i < curSize; i++)
				{
					m_data[i].~T();
				}
			} else
			{
				if (newsize > curSize)
				{
					reserve(newsize);
				}
#ifdef BT_USE_PLACEMENT_NEW
				for (int i=curSize;i<newsize;i++)
				{
					new ( &m_data[i]) T(fillData);
				}
#endif //BT_USE_PLACEMENT_NEW

			}

			m_size = newsize;
		}